

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_cmd.c
# Opt level: O3

int cfg_cmd_handle_schema(cfg_db *db,char *arg,autobuf *log)

{
  long lVar1;
  code *pcVar2;
  undefined8 *puVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  long *plVar7;
  size_t sVar8;
  undefined8 *puVar9;
  long lVar10;
  long *plVar11;
  list_entity *plVar12;
  char *pcVar13;
  list_entity *plVar14;
  long *plVar15;
  cfg_schema *pcVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  char *local_40;
  char *local_38;
  
  pcVar16 = db->schema;
  if (pcVar16 == (cfg_schema *)0x0) {
    abuf_puts(log,"Internal error, database not connected to schema\n");
    iVar4 = -1;
  }
  else {
    if ((arg == (char *)0x0) || (*arg == '\0')) {
      abuf_puts(log,
                "List of section types:\n(use this command with the types as parameter for more information)\n"
               );
      plVar12 = (db->schema->sections).list_head.next;
      if (plVar12->prev != (db->schema->sections).list_head.prev) {
        do {
          if (*(char *)((long)&plVar12[3].next + 1) == '\0') {
            plVar14 = plVar12[5].next;
            pcVar5 = ": ";
            if (plVar14 == (list_entity *)0x0) {
              pcVar5 = "";
              plVar14 = (list_entity *)0x108cb9;
            }
            cfg_append_printable_line
                      (log,"    %s (%s)%s%s",plVar12[3].prev,
                       CFG_SCHEMA_SECTIONMODE[*(uint *)&plVar12[4].prev],pcVar5,plVar14);
          }
          else if (plVar12[5].next != (list_entity *)0x0) {
            cfg_append_printable_line(log,"        %s");
          }
          plVar12 = plVar12->next;
        } while (plVar12->prev != (db->schema->sections).list_head.prev);
      }
    }
    else {
      iVar4 = strcmp(arg,"all");
      if (iVar4 != 0) {
        pcVar5 = strdup(arg);
        pcVar6 = strchr(pcVar5,0x2e);
        if (pcVar6 == (char *)0x0) {
          iVar4 = _print_schema_section(log,db,pcVar5);
        }
        else {
          local_38 = pcVar6 + 1;
          *pcVar6 = '\0';
          local_40 = pcVar5;
          plVar7 = (long *)avl_find(&db->schema->entries);
          if (plVar7 != (long *)0x0) {
            plVar11 = (long *)0x0;
            plVar15 = plVar7;
            do {
              if ((avl_tree *)plVar15 == &db->schema->entries) break;
              if (plVar15 == plVar7) {
                pcVar13 = "";
                pcVar6 = "";
                if (plVar15[10] == 0) {
                  pcVar6 = " (mandatory)";
                }
                if ((char)plVar15[0xd] != '\0') {
                  pcVar13 = " (list)";
                }
                cfg_append_printable_line(log,"    %s%s%s",plVar15[9],pcVar6,pcVar13);
                if (plVar15[10] != 0) {
                  cfg_append_printable_line(log,"    Default value:");
                  pcVar6 = (char *)plVar15[10];
                  if (pcVar6 != (char *)0x0) {
                    pcVar13 = pcVar6 + plVar15[0xb];
                    for (; pcVar6 < pcVar13; pcVar6 = pcVar6 + sVar8 + 1) {
                      cfg_append_printable_line(log,"        \'%s\'",pcVar6);
                      sVar8 = strlen(pcVar6);
                      pcVar13 = (char *)(plVar15[0xb] + plVar15[10]);
                    }
                  }
                }
              }
              else if (*(char *)((long)plVar15 + 0x31) == '\0') break;
              pcVar2 = (code *)plVar15[0xf];
              if (pcVar2 != (code *)0x0) {
                if ((plVar11 != (long *)0x0) && ((code *)plVar11[0xf] == pcVar2)) {
                  auVar17[0] = -((char)plVar15[0x10] == (char)plVar11[0x10]);
                  auVar17[1] = -(*(char *)((long)plVar15 + 0x81) == *(char *)((long)plVar11 + 0x81))
                  ;
                  auVar17[2] = -(*(char *)((long)plVar15 + 0x82) == *(char *)((long)plVar11 + 0x82))
                  ;
                  auVar17[3] = -(*(char *)((long)plVar15 + 0x83) == *(char *)((long)plVar11 + 0x83))
                  ;
                  auVar17[4] = -(*(char *)((long)plVar15 + 0x84) == *(char *)((long)plVar11 + 0x84))
                  ;
                  auVar17[5] = -(*(char *)((long)plVar15 + 0x85) == *(char *)((long)plVar11 + 0x85))
                  ;
                  auVar17[6] = -(*(char *)((long)plVar15 + 0x86) == *(char *)((long)plVar11 + 0x86))
                  ;
                  auVar17[7] = -(*(char *)((long)plVar15 + 0x87) == *(char *)((long)plVar11 + 0x87))
                  ;
                  auVar17[8] = -((char)plVar15[0x11] == (char)plVar11[0x11]);
                  auVar17[9] = -(*(char *)((long)plVar15 + 0x89) == *(char *)((long)plVar11 + 0x89))
                  ;
                  auVar17[10] = -(*(char *)((long)plVar15 + 0x8a) == *(char *)((long)plVar11 + 0x8a)
                                 );
                  auVar17[0xb] = -(*(char *)((long)plVar15 + 0x8b) ==
                                  *(char *)((long)plVar11 + 0x8b));
                  auVar17[0xc] = -(*(char *)((long)plVar15 + 0x8c) ==
                                  *(char *)((long)plVar11 + 0x8c));
                  auVar17[0xd] = -(*(char *)((long)plVar15 + 0x8d) ==
                                  *(char *)((long)plVar11 + 0x8d));
                  auVar17[0xe] = -(*(char *)((long)plVar15 + 0x8e) ==
                                  *(char *)((long)plVar11 + 0x8e));
                  auVar17[0xf] = -(*(char *)((long)plVar15 + 0x8f) ==
                                  *(char *)((long)plVar11 + 0x8f));
                  lVar10 = plVar11[0x12];
                  lVar1 = plVar15[0x12];
                  auVar18[0] = -((char)lVar1 == (char)lVar10);
                  auVar18[1] = -((char)((ulong)lVar1 >> 8) == (char)((ulong)lVar10 >> 8));
                  auVar18[2] = -((char)((ulong)lVar1 >> 0x10) == (char)((ulong)lVar10 >> 0x10));
                  auVar18[3] = -((char)((ulong)lVar1 >> 0x18) == (char)((ulong)lVar10 >> 0x18));
                  auVar18[4] = -((char)((ulong)lVar1 >> 0x20) == (char)((ulong)lVar10 >> 0x20));
                  auVar18[5] = -((char)((ulong)lVar1 >> 0x28) == (char)((ulong)lVar10 >> 0x28));
                  auVar18[6] = -((char)((ulong)lVar1 >> 0x30) == (char)((ulong)lVar10 >> 0x30));
                  auVar18[7] = -((char)((ulong)lVar1 >> 0x38) == (char)((ulong)lVar10 >> 0x38));
                  auVar18[8] = 0xff;
                  auVar18[9] = 0xff;
                  auVar18[10] = 0xff;
                  auVar18[0xb] = 0xff;
                  auVar18[0xc] = 0xff;
                  auVar18[0xd] = 0xff;
                  auVar18[0xe] = 0xff;
                  auVar18[0xf] = 0xff;
                  auVar18 = auVar18 & auVar17;
                  if ((ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                               (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                               (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                               (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                               (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                               (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                               (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                               (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                               (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                               (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                               (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                               (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                               (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                               (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe |
                              (ushort)(byte)(auVar18[0xf] >> 7) << 0xf) == 0xffff)
                  goto LAB_00103edf;
                }
                (*pcVar2)(plVar15,log);
                plVar11 = plVar15;
              }
LAB_00103edf:
              plVar15 = (long *)*plVar15;
            } while (plVar15 != (long *)0x0);
          }
          puVar9 = (undefined8 *)avl_find(&db->schema->entries,&local_40);
          for (puVar3 = puVar9;
              (puVar3 != (undefined8 *)0x0 && ((avl_tree *)puVar3 != &db->schema->entries));
              puVar3 = (undefined8 *)*puVar3) {
            if (puVar3 == puVar9) {
              if (puVar3[0xc] != 0) {
                abuf_puts(log,"    Description:\n");
                lVar10 = puVar3[0xc];
                goto LAB_001040be;
              }
            }
            else {
              if (*(char *)((long)puVar3 + 0x31) == '\0') break;
              lVar10 = puVar3[0xc];
              if (lVar10 != 0) {
LAB_001040be:
                cfg_append_printable_line(log,"        %s",lVar10);
              }
            }
          }
          iVar4 = 0;
        }
        free(pcVar5);
        return iVar4;
      }
      plVar12 = (pcVar16->sections).list_head.next;
      if (plVar12->prev != (pcVar16->sections).list_head.prev) {
        plVar14 = (list_entity *)0x0;
        do {
          if (plVar14 == (list_entity *)0x0) {
LAB_00104117:
            _print_schema_section(log,db,(char *)plVar12[3].prev);
            plVar14 = plVar12[3].prev;
            pcVar16 = db->schema;
          }
          else {
            iVar4 = strcasecmp((char *)plVar12[3].prev,(char *)plVar14);
            if (iVar4 != 0) {
              abuf_puts(log,"\n");
              goto LAB_00104117;
            }
          }
          plVar12 = plVar12->next;
        } while (plVar12->prev != (pcVar16->sections).list_head.prev);
      }
    }
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int
cfg_cmd_handle_schema(struct cfg_db *db, const char *arg, struct autobuf *log) {
  struct cfg_schema_section *s_section;
  char *copy, *ptr;
  int result;

  if (db->schema == NULL) {
    abuf_puts(log, "Internal error, database not connected to schema\n");
    return -1;
  }

  if (arg == NULL || *arg == 0) {
    abuf_puts(log, "List of section types:\n"
                   "(use this command with the types as parameter for more information)\n");
    avl_for_each_element(&db->schema->sections, s_section, _section_node) {
      if (!s_section->_section_node.follower) {
        cfg_append_printable_line(log, CFG_HELP_INDENT_PREFIX "%s (%s)%s%s", s_section->type,
          CFG_SCHEMA_SECTIONMODE[s_section->mode], s_section->help ? ": " : "", s_section->help ? s_section->help : "");
      }
      else if (s_section->help) {
        cfg_append_printable_line(log, CFG_HELP_INDENT_PREFIX CFG_HELP_INDENT_PREFIX "%s", s_section->help);
      }
    }
    return 0;
  }

  if (strcmp(arg, "all") == 0) {
    const char *last_type = NULL;

    avl_for_each_element(&db->schema->sections, s_section, _section_node) {
      if (last_type == NULL || strcasecmp(s_section->type, last_type) != 0) {
        if (last_type != NULL) {
          abuf_puts(log, "\n");
        }
        _print_schema_section(log, db, s_section->type);
        last_type = s_section->type;
      }
    }
    return 0;
  }

  /* copy string into stack*/
  copy = strdup(arg);

  /* prepare for cleanup */
  result = -1;

  ptr = strchr(copy, '.');
  if (ptr) {
    *ptr++ = 0;
  }

  if (ptr == NULL) {
    result = _print_schema_section(log, db, copy);
  }
  else {
    result = _print_schema_entry(log, db, copy, ptr);
  }

  free(copy);
  return result;
}